

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O1

void __thiscall QVersionNumber::SegmentStorage::setListData(SegmentStorage *this,QList<int> *seg)

{
  qsizetype qVar1;
  Data *pDVar2;
  int *piVar3;
  QList<int> *pQVar4;
  
  pQVar4 = (QList<int> *)operator_new(0x18);
  pDVar2 = (seg->d).d;
  piVar3 = (seg->d).ptr;
  (seg->d).d = (Data *)0x0;
  (seg->d).ptr = (int *)0x0;
  (pQVar4->d).d = pDVar2;
  (pQVar4->d).ptr = piVar3;
  qVar1 = (seg->d).size;
  (seg->d).size = 0;
  (pQVar4->d).size = qVar1;
  (this->field_0).pointer_segments = pQVar4;
  return;
}

Assistant:

void QVersionNumber::SegmentStorage::setListData(QList<int> &&seg)
{
    pointer_segments = new QList<int>(std::move(seg));
}